

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O1

void __thiscall LTAircraft::ChangeModel(LTAircraft *this)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  FlightModel *pFVar7;
  Doc8643 *pDVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  string oldModelName;
  string oldIcaotype;
  string local_318;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long *local_298 [2];
  long local_288 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  long *local_258 [2];
  long local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long *local_218 [2];
  long local_208 [2];
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  FDStaticData statData;
  
  statData.reg._M_dataplus._M_p = (pointer)&statData.reg.field_2;
  statData.reg._M_string_length = 0;
  statData.reg.field_2._M_local_buf[0] = '\0';
  statData.country._M_dataplus._M_p = (pointer)&statData.country.field_2;
  statData.country._M_string_length = 0;
  statData.country.field_2._M_local_buf[0] = '\0';
  statData.acTypeIcao._M_dataplus._M_p = (pointer)&statData.acTypeIcao.field_2;
  statData.acTypeIcao._M_string_length = 0;
  statData.acTypeIcao.field_2._M_local_buf[0] = '\0';
  statData.man._M_dataplus._M_p = (pointer)&statData.man.field_2;
  statData.man._M_string_length = 0;
  statData.man.field_2._M_local_buf[0] = '\0';
  statData.mdl._M_dataplus._M_p = (pointer)&statData.mdl.field_2;
  statData.mdl._M_string_length = 0;
  statData.mdl.field_2._M_local_buf[0] = '\0';
  statData.catDescr._M_dataplus._M_p = (pointer)&statData.catDescr.field_2;
  statData.catDescr._M_string_length = 0;
  statData.catDescr.field_2._M_local_buf[0] = '\0';
  statData.engType = -1;
  statData.engMount = -1;
  statData.year = 0;
  statData.mil = false;
  statData.pDoc8643 = (Doc8643 *)0x0;
  statData.call._M_dataplus._M_p = (pointer)&statData.call.field_2;
  statData.call._M_string_length = 0;
  statData.call.field_2._M_local_buf[0] = '\0';
  statData.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statData.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statData.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  statData.flight._M_dataplus._M_p = (pointer)&statData.flight.field_2;
  statData.flight._M_string_length = 0;
  statData.flight.field_2._M_local_buf[0] = '\0';
  statData.slug._M_dataplus._M_p = (pointer)&statData.slug.field_2;
  statData.slug._M_string_length = 0;
  statData.slug.field_2._M_local_buf[0] = '\0';
  statData.op._M_dataplus._M_p = (pointer)&statData.op.field_2;
  statData.op._M_string_length = 0;
  statData.op.field_2._M_local_buf[0] = '\0';
  statData.opIcao._M_dataplus._M_p = (pointer)&statData.opIcao.field_2;
  statData.opIcao._M_string_length = 0;
  statData.opIcao.field_2._M_local_buf[0] = '\0';
  statData.bDataMaster = false;
  statData.bDataRoute = false;
  bVar3 = LTFlightData::TryGetSafeCopy(this->fd,&statData);
  if (!bVar3) goto LAB_00158c33;
  oldIcaotype._M_dataplus._M_p = (pointer)&oldIcaotype.field_2;
  pcVar1 = (this->super_Aircraft).acIcaoType._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oldIcaotype,pcVar1,
             pcVar1 + (this->super_Aircraft).acIcaoType._M_string_length);
  psVar5 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
  oldModelName._M_dataplus._M_p = (pointer)&oldModelName.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oldModelName,pcVar1,pcVar1 + psVar5->_M_string_length);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,dataRefs.cslFixAcIcaoType._M_dataplus._M_p,
             dataRefs.cslFixAcIcaoType._M_dataplus._M_p + dataRefs.cslFixAcIcaoType._M_string_length
            );
  plVar9 = local_208;
  local_218[0] = plVar9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,statData.acTypeIcao._M_dataplus._M_p,
             statData.acTypeIcao._M_dataplus._M_p + statData.acTypeIcao._M_string_length);
  local_1d8._M_array = &local_238;
  local_1d8._M_len = 2;
  str_first_non_empty(&local_2d8,&local_1d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,dataRefs.cslFixOpIcao._M_dataplus._M_p,
             dataRefs.cslFixOpIcao._M_dataplus._M_p + dataRefs.cslFixOpIcao._M_string_length);
  if (statData.opIcao._M_string_length == 0) {
    std::__cxx11::string::substr((ulong)local_298,(ulong)&statData.call);
  }
  else {
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,statData.opIcao._M_dataplus._M_p,
               statData.opIcao._M_dataplus._M_p + statData.opIcao._M_string_length);
  }
  local_1e8._M_array = &local_2b8;
  local_1e8._M_len = 2;
  str_first_non_empty(&local_2f8,&local_1e8);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,dataRefs.cslFixLivery._M_dataplus._M_p,
             dataRefs.cslFixLivery._M_dataplus._M_p + dataRefs.cslFixLivery._M_string_length);
  plVar10 = local_248;
  local_258[0] = plVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,statData.reg._M_dataplus._M_p,
             statData.reg._M_dataplus._M_p + statData.reg._M_string_length);
  local_1f8._M_array = &local_278;
  local_1f8._M_len = 2;
  str_first_non_empty(&local_318,&local_1f8);
  XPMP2::Aircraft::ChangeModel(&this->super_Aircraft,&local_2d8,&local_2f8,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  psVar5 = &(this->super_Aircraft).acIcaoType;
  lVar11 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  lVar11 = -0x40;
  plVar10 = local_288;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  lVar11 = -0x40;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  CalcLabelInternal(this,&statData);
  psVar6 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
  if (oldModelName._M_string_length == psVar6->_M_string_length) {
    if (oldModelName._M_string_length != 0) {
      iVar4 = bcmp(oldModelName._M_dataplus._M_p,(psVar6->_M_dataplus)._M_p,
                   oldModelName._M_string_length);
      if (iVar4 != 0) goto LAB_00158b54;
    }
    if (oldIcaotype._M_string_length != (this->super_Aircraft).acIcaoType._M_string_length)
    goto LAB_00158b54;
    if (oldIcaotype._M_string_length != 0) {
      iVar4 = bcmp(oldIcaotype._M_dataplus._M_p,(psVar5->_M_dataplus)._M_p,
                   oldIcaotype._M_string_length);
      if (iVar4 != 0) goto LAB_00158b54;
    }
  }
  else {
LAB_00158b54:
    pFVar7 = FlightModel::FindFlightModel(this->fd,true,(string **)0x0);
    this->pMdl = pFVar7;
    pDVar8 = Doc8643::get(psVar5);
    this->pDoc8643 = pDVar8;
    bVar3 = LTFlightData::FDStaticData::isStaticObject(&statData);
    _Var2 = statData.opIcao._M_dataplus;
    this->bStaticObject = bVar3;
    if ((int)dataRefs.iLogLevel < 2) {
      pcVar1 = (this->labelInternal)._M_dataplus._M_p;
      psVar5 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0xbc1,"ChangeModel",logINFO,
             "Changed CSL model for aircraft %s, operator \'%s\': a/c model now \'%s\' (Flight model \'%s\')"
             ,pcVar1,_Var2._M_p,(psVar5->_M_dataplus)._M_p,(this->pMdl->modelName)._M_dataplus._M_p)
      ;
    }
  }
  this->bChangeModel = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oldModelName._M_dataplus._M_p != &oldModelName.field_2) {
    operator_delete(oldModelName._M_dataplus._M_p,oldModelName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oldIcaotype._M_dataplus._M_p != &oldIcaotype.field_2) {
    operator_delete(oldIcaotype._M_dataplus._M_p,oldIcaotype.field_2._M_allocated_capacity + 1);
  }
LAB_00158c33:
  LTFlightData::FDStaticData::~FDStaticData(&statData);
  return;
}

Assistant:

void LTAircraft::ChangeModel ()
{
    // Try to fetch the static data
    LTFlightData::FDStaticData statData;
    if (!fd.TryGetSafeCopy(statData))
        return;
    
    // Save previous model name to identify an actual change
    const std::string oldIcaotype(acIcaoType);
    const std::string oldModelName(GetModelName());
    XPMP2::Aircraft::ChangeModel(str_first_non_empty({dataRefs.cslFixAcIcaoType, statData.acTypeIcao}),
                                 str_first_non_empty({dataRefs.cslFixOpIcao,     statData.airlineCode()}),
                                 str_first_non_empty({dataRefs.cslFixLivery,     statData.reg}));
    CalcLabelInternal(statData);

    // if there was an actual change inform the log
    if (oldModelName != GetModelName() ||
        oldIcaotype  != acIcaoType) {
        // also update the flight model to be used
        pMdl = &FlightModel::FindFlightModel(fd, true);
        pDoc8643 = &Doc8643::get(acIcaoType);
        bStaticObject = statData.isStaticObject();
        LOG_MSG(logINFO,INFO_AC_MDL_CHANGED,
                labelInternal.c_str(),
                statData.opIcao.c_str(),
                GetModelName().c_str(), pMdl->modelName.c_str());
    }
    
    // reset the flag that we needed to change the model
    bChangeModel = false;
}